

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bestfitobb.cpp
# Opt level: O1

void computeOBB(uint vcount,float *points,uint pstride,float *sides,float *matrix)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  float *p;
  undefined1 auVar3 [16];
  float fVar4;
  float fVar5;
  undefined1 auVar6 [64];
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [64];
  float t [3];
  float local_74;
  uint local_70;
  uint local_6c;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  if (vcount == 0) {
    fVar5 = -1e+09;
    fVar4 = -1e+09;
    auVar3 = SUB6416(ZEXT464(0x4e6e6b28),0);
    fVar7 = -1e+09;
    local_58 = auVar3;
    local_48 = auVar3;
  }
  else {
    auVar6 = ZEXT464(0x4e6e6b28);
    auVar9 = ZEXT464(0xce6e6b28);
    auVar8 = auVar9._0_16_;
    local_48 = auVar6._0_16_;
    auVar2 = auVar8;
    local_58 = local_48;
    do {
      local_68 = auVar6._0_16_;
      fm_inverseRT(matrix,points,&local_74);
      auVar3 = vminss_avx(ZEXT416((uint)local_74),local_68);
      auVar6 = ZEXT1664(auVar3);
      local_58 = vminss_avx(ZEXT416(local_70),local_58);
      local_48 = vminss_avx(ZEXT416(local_6c),local_48);
      auVar1 = vmaxss_avx(ZEXT416((uint)local_74),ZEXT416(auVar9._0_4_));
      auVar9 = ZEXT1664(auVar1);
      fVar7 = auVar1._0_4_;
      auVar2 = vmaxss_avx(ZEXT416(local_70),ZEXT416(auVar2._0_4_));
      fVar5 = auVar2._0_4_;
      auVar8 = vmaxss_avx(ZEXT416(local_6c),ZEXT416(auVar8._0_4_));
      fVar4 = auVar8._0_4_;
      points = (float *)((long)points + (ulong)pstride);
      vcount = vcount - 1;
    } while (vcount != 0);
  }
  *sides = fVar7;
  sides[1] = fVar5;
  sides[2] = fVar4;
  auVar2._8_4_ = 0x7fffffff;
  auVar2._0_8_ = 0x7fffffff7fffffff;
  auVar2._12_4_ = 0x7fffffff;
  auVar3 = vandps_avx512vl(auVar3,auVar2);
  if (fVar7 < auVar3._0_4_) {
    *sides = auVar3._0_4_;
  }
  auVar3._8_4_ = 0x7fffffff;
  auVar3._0_8_ = 0x7fffffff7fffffff;
  auVar3._12_4_ = 0x7fffffff;
  auVar3 = vandps_avx512vl(local_58,auVar3);
  if (fVar5 < auVar3._0_4_) {
    sides[1] = auVar3._0_4_;
  }
  auVar8._8_4_ = 0x7fffffff;
  auVar8._0_8_ = 0x7fffffff7fffffff;
  auVar8._12_4_ = 0x7fffffff;
  auVar3 = vandps_avx512vl(local_48,auVar8);
  if (fVar4 < auVar3._0_4_) {
    sides[2] = auVar3._0_4_;
  }
  *sides = *sides + *sides;
  sides[1] = sides[1] + sides[1];
  sides[2] = sides[2] + sides[2];
  return;
}

Assistant:

void computeOBB(unsigned int vcount,const float *points,unsigned int pstride,float *sides,const float *matrix)
{
  const char *src = (const char *) points;

  float bmin[3] = { 1e9, 1e9, 1e9 };
  float bmax[3] = { -1e9, -1e9, -1e9 };

  for (unsigned int i=0; i<vcount; i++)
  {
    const float *p = (const float *) src;
    float t[3];

    fm_inverseRT(matrix, p, t ); // inverse rotate translate

    if ( t[0] < bmin[0] ) bmin[0] = t[0];
    if ( t[1] < bmin[1] ) bmin[1] = t[1];
    if ( t[2] < bmin[2] ) bmin[2] = t[2];

    if ( t[0] > bmax[0] ) bmax[0] = t[0];
    if ( t[1] > bmax[1] ) bmax[1] = t[1];
    if ( t[2] > bmax[2] ) bmax[2] = t[2];

    src+=pstride;
  }


  sides[0] = bmax[0];
  sides[1] = bmax[1];
  sides[2] = bmax[2];

  if ( fabsf(bmin[0]) > sides[0] ) sides[0] = fabsf(bmin[0]);
  if ( fabsf(bmin[1]) > sides[1] ) sides[1] = fabsf(bmin[1]);
  if ( fabsf(bmin[2]) > sides[2] ) sides[2] = fabsf(bmin[2]);

  sides[0]*=2.0f;
  sides[1]*=2.0f;
  sides[2]*=2.0f;

}